

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O3

String * __thiscall
glcts::LayoutBindingBaseCase::buildAccess
          (String *__return_storage_ptr__,LayoutBindingBaseCase *this,String *var)

{
  char *pcVar1;
  int iVar2;
  undefined4 extraout_var;
  size_t sVar3;
  ostream *poVar4;
  undefined4 extraout_var_00;
  ostringstream s;
  undefined1 local_198 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this);
  pcVar1 = *(char **)(CONCAT44(extraout_var,iVar2) + 0x28);
  if (pcVar1 == (char *)0x0) {
    std::ios::clear((int)local_198 + (int)*(_func_int **)(local_198._0_8_ + -0x18));
  }
  else {
    sVar3 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,pcVar1,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"(",1);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_198,(var->_M_dataplus)._M_p,var->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,",",1);
  iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this);
  pcVar1 = *(char **)(CONCAT44(extraout_var_00,iVar2) + 0x20);
  if (pcVar1 == (char *)0x0) {
    std::ios::clear((int)poVar4 + (int)poVar4->_vptr_basic_ostream[-3]);
  }
  else {
    sVar3 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar1,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"(0)",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

virtual String buildAccess(const String& var)
	{
		std::ostringstream s;
		s << getTestParameters().access_function << "(" << var << "," << getTestParameters().coord_vector_type << "(0)"
		  << ")";
		return s.str();
	}